

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_ctrl.c
# Opt level: O0

int EVP_PKEY_CTX_set0_ecdh_kdf_ukm(EVP_PKEY_CTX *ctx,uchar *ukm,int len)

{
  void *in_RSI;
  OSSL_PARAM *p;
  OSSL_PARAM params [2];
  int ret;
  EVP_PKEY_CTX *in_stack_ffffffffffffff18;
  undefined8 *puVar1;
  size_t in_stack_ffffffffffffff20;
  OSSL_PARAM *pOVar2;
  OSSL_PARAM *params_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  char *file;
  undefined8 uStack_c8;
  void *local_c0;
  size_t sStack_b8;
  size_t local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_78 [5];
  OSSL_PARAM local_50;
  int iVar3;
  int local_4;
  
  puVar1 = local_78;
  local_4 = evp_pkey_ctx_getset_ecdh_param_checks(in_stack_ffffffffffffff18);
  if (local_4 == 1) {
    pOVar2 = &local_50;
    OSSL_PARAM_construct_octet_string
              (in_stack_ffffffffffffff30,
               (void *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20);
    puVar1[4] = local_88;
    puVar1[2] = local_98;
    puVar1[3] = uStack_90;
    *puVar1 = local_a8;
    puVar1[1] = uStack_a0;
    OSSL_PARAM_construct_end();
    params_00 = pOVar2;
    pOVar2->return_size = local_b0;
    file = in_stack_ffffffffffffff30;
    pOVar2->data = local_c0;
    pOVar2->data_size = sStack_b8;
    pOVar2->key = in_stack_ffffffffffffff30;
    *(undefined8 *)&pOVar2->data_type = uStack_c8;
    local_4 = evp_pkey_ctx_set_params_strict
                        ((EVP_PKEY_CTX *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),params_00);
    if (local_4 == -2) {
      iVar3 = local_4;
      ERR_new();
      ERR_set_debug(file,local_4,(char *)params_00);
      ERR_set_error(6,0x93,(char *)0x0);
      local_4 = iVar3;
    }
    else if (local_4 == 1) {
      CRYPTO_free(in_RSI);
    }
  }
  return local_4;
}

Assistant:

int EVP_PKEY_CTX_set0_ecdh_kdf_ukm(EVP_PKEY_CTX *ctx, unsigned char *ukm, int len)
{
    int ret;
    OSSL_PARAM params[2], *p = params;

    ret = evp_pkey_ctx_getset_ecdh_param_checks(ctx);
    if (ret != 1)
        return ret;

    *p++ = OSSL_PARAM_construct_octet_string(OSSL_EXCHANGE_PARAM_KDF_UKM,
                                            /*
                                             * Cast away the const. This is read
                                             * only so should be safe
                                             */
                                            (void *)ukm,
                                            (size_t)len);
    *p++ = OSSL_PARAM_construct_end();

    ret = evp_pkey_ctx_set_params_strict(ctx, params);

    switch (ret) {
    case -2:
        ERR_raise(ERR_LIB_EVP, EVP_R_COMMAND_NOT_SUPPORTED);
        break;
    case 1:
        OPENSSL_free(ukm);
        break;
    }

    return ret;
}